

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int rtreeUpdate(sqlite3_vtab *pVtab,int nData,sqlite3_value **aData,sqlite_int64 *pRowid)

{
  uint uVar1;
  uint uVar2;
  Mem *pMVar3;
  sqlite3_stmt *pStmt;
  bool bVar4;
  RtreeNode *pNode;
  uint uVar8;
  int iVar5;
  i64 iVar6;
  i64 iVar7;
  undefined4 in_register_00000034;
  int iVar9;
  long lVar10;
  double dVar11;
  float fVar12;
  float fVar13;
  RtreeNode *pLeaf;
  sqlite_int64 *local_70;
  undefined8 local_68;
  RtreeCell cell;
  
  local_68 = CONCAT44(in_register_00000034,nData);
  if (*(int *)&pVtab[3].field_0xc != 0) {
    return 0x206;
  }
  *(int *)&pVtab[2].zErrMsg = *(int *)&pVtab[2].zErrMsg + 1;
  cell.iRowid = 0;
  iVar9 = 0;
  bVar4 = true;
  if (1 < nData) {
    uVar8 = (uint)(byte)pVtab[1].field_0xd;
    if ((int)(nData - 4U) < (int)(uint)(byte)pVtab[1].field_0xd) {
      uVar8 = nData - 4U;
    }
    local_70 = pRowid;
    if (pVtab[1].field_0xe == '\0') {
      lVar10 = 0;
      do {
        if ((int)uVar8 <= lVar10) goto LAB_001c4646;
        dVar11 = sqlite3VdbeRealValue(aData[lVar10 + 3]);
        fVar13 = (float)dVar11;
        if (dVar11 < (double)fVar13) {
          fVar13 = (float)(dVar11 * *(double *)(&DAT_001ea530 + (ulong)(dVar11 < 0.0) * 8));
        }
        cell.aCoord[lVar10].f = fVar13;
        dVar11 = sqlite3VdbeRealValue(aData[lVar10 + 4]);
        fVar12 = (float)dVar11;
        if ((double)fVar12 < dVar11) {
          fVar12 = (float)(dVar11 * *(double *)(&DAT_001ea540 + (ulong)(dVar11 < 0.0) * 8));
        }
        cell.aCoord[lVar10 + 1].f = fVar12;
        lVar10 = lVar10 + 2;
      } while (fVar13 <= fVar12);
    }
    else {
      lVar10 = 0;
      do {
        if ((int)uVar8 <= lVar10) goto LAB_001c4646;
        iVar6 = sqlite3VdbeIntValue(aData[lVar10 + 3]);
        cell.aCoord[lVar10].i = (int)iVar6;
        iVar7 = sqlite3VdbeIntValue(aData[lVar10 + 4]);
        cell.aCoord[lVar10 + 1].i = (int)iVar7;
        lVar10 = lVar10 + 2;
      } while ((int)iVar6 <= (int)iVar7);
    }
    iVar9 = (int)lVar10 + -1;
LAB_001c463c:
    iVar9 = rtreeConstraintError((Rtree *)pVtab,iVar9);
    goto LAB_001c4798;
  }
LAB_001c46e8:
  pMVar3 = *aData;
  uVar2._0_2_ = pMVar3->flags;
  uVar2._2_1_ = pMVar3->enc;
  uVar2._3_1_ = pMVar3->eSubtype;
  if ((0xaaaaaaaaU >> (uVar2 & 0x1f) & 1) == 0) {
    iVar6 = sqlite3VdbeIntValue(pMVar3);
    iVar9 = rtreeDeleteRowid((Rtree *)pVtab,iVar6);
  }
  if ((1 < (int)local_68) && (iVar9 == 0)) {
    pLeaf = (RtreeNode *)0x0;
    if (bVar4) {
      sqlite3_bind_null((sqlite3_stmt *)pVtab[6].pModule,1);
      sqlite3_bind_null((sqlite3_stmt *)pVtab[6].pModule,2);
      sqlite3_step((sqlite3_stmt *)pVtab[6].pModule);
      iVar9 = sqlite3_reset((sqlite3_stmt *)pVtab[6].pModule);
      cell.iRowid = (i64)(pVtab[1].pModule)->xClose;
      *pRowid = cell.iRowid;
      if (iVar9 != 0) goto LAB_001c4798;
    }
    else {
      *pRowid = cell.iRowid;
    }
    iVar9 = ChooseLeaf((Rtree *)pVtab,&cell,0,&pLeaf);
    pNode = pLeaf;
    if (iVar9 == 0) {
      pVtab[4].nRef = -1;
      iVar5 = rtreeInsertCell((Rtree *)pVtab,pLeaf,&cell,0);
      iVar9 = nodeRelease((Rtree *)pVtab,pNode);
      if (iVar5 != 0) {
        iVar9 = iVar5;
      }
      if ((iVar9 == 0) && (iVar9 = 0, *(char *)((long)&pVtab[1].zErrMsg + 1) != '\0')) {
        pStmt = (sqlite3_stmt *)pVtab[7].zErrMsg;
        sqlite3_bind_int64(pStmt,1,*pRowid);
        for (lVar10 = 3; (int)lVar10 - 3U < (uint)*(byte *)((long)&pVtab[1].zErrMsg + 1);
            lVar10 = lVar10 + 1) {
          sqlite3_bind_value(pStmt,(int)lVar10 + -1,aData[(ulong)(byte)pVtab[1].field_0xd + lVar10])
          ;
        }
        sqlite3_step(pStmt);
        iVar9 = sqlite3_reset(pStmt);
      }
    }
  }
LAB_001c4798:
  rtreeRelease((Rtree *)pVtab);
  return iVar9;
LAB_001c4646:
  pRowid = local_70;
  pMVar3 = aData[2];
  uVar8._0_2_ = pMVar3->flags;
  uVar8._2_1_ = pMVar3->enc;
  uVar8._3_1_ = pMVar3->eSubtype;
  if ((0xaaaaaaaaU >> (uVar8 & 0x1f) & 1) == 0) {
    iVar6 = sqlite3VdbeIntValue(pMVar3);
    pMVar3 = *aData;
    uVar1._0_2_ = pMVar3->flags;
    uVar1._2_1_ = pMVar3->enc;
    uVar1._3_1_ = pMVar3->eSubtype;
    cell.iRowid = iVar6;
    if ((0xaaaaaaaaU >> (uVar1 & 0x1f) & 1) == 0) {
      iVar7 = sqlite3VdbeIntValue(pMVar3);
      bVar4 = false;
      iVar9 = 0;
      if (iVar7 == iVar6) goto LAB_001c46e8;
    }
    sqlite3_bind_int64((sqlite3_stmt *)pVtab[5].zErrMsg,1,iVar6);
    iVar5 = sqlite3_step((sqlite3_stmt *)pVtab[5].zErrMsg);
    iVar9 = sqlite3_reset((sqlite3_stmt *)pVtab[5].zErrMsg);
    if (iVar5 == 100) {
      if (*(char *)((long)&(pVtab[1].pModule)->xRowid + 6) != '\x05') {
        iVar9 = 0;
        goto LAB_001c463c;
      }
      iVar9 = rtreeDeleteRowid((Rtree *)pVtab,iVar6);
    }
    bVar4 = false;
  }
  goto LAB_001c46e8;
}

Assistant:

static int rtreeUpdate(
  sqlite3_vtab *pVtab, 
  int nData, 
  sqlite3_value **aData, 
  sqlite_int64 *pRowid
){
  Rtree *pRtree = (Rtree *)pVtab;
  int rc = SQLITE_OK;
  RtreeCell cell;                 /* New cell to insert if nData>1 */
  int bHaveRowid = 0;             /* Set to 1 after new rowid is determined */

  if( pRtree->nNodeRef ){
    /* Unable to write to the btree while another cursor is reading from it,
    ** since the write might do a rebalance which would disrupt the read
    ** cursor. */
    return SQLITE_LOCKED_VTAB;
  }
  rtreeReference(pRtree);
  assert(nData>=1);

  cell.iRowid = 0;  /* Used only to suppress a compiler warning */

  /* Constraint handling. A write operation on an r-tree table may return
  ** SQLITE_CONSTRAINT for two reasons:
  **
  **   1. A duplicate rowid value, or
  **   2. The supplied data violates the "x2>=x1" constraint.
  **
  ** In the first case, if the conflict-handling mode is REPLACE, then
  ** the conflicting row can be removed before proceeding. In the second
  ** case, SQLITE_CONSTRAINT must be returned regardless of the
  ** conflict-handling mode specified by the user.
  */
  if( nData>1 ){
    int ii;
    int nn = nData - 4;

    if( nn > pRtree->nDim2 ) nn = pRtree->nDim2;
    /* Populate the cell.aCoord[] array. The first coordinate is aData[3].
    **
    ** NB: nData can only be less than nDim*2+3 if the rtree is mis-declared
    ** with "column" that are interpreted as table constraints.
    ** Example:  CREATE VIRTUAL TABLE bad USING rtree(x,y,CHECK(y>5));
    ** This problem was discovered after years of use, so we silently ignore
    ** these kinds of misdeclared tables to avoid breaking any legacy.
    */

#ifndef SQLITE_RTREE_INT_ONLY
    if( pRtree->eCoordType==RTREE_COORD_REAL32 ){
      for(ii=0; ii<nn; ii+=2){
        cell.aCoord[ii].f = rtreeValueDown(aData[ii+3]);
        cell.aCoord[ii+1].f = rtreeValueUp(aData[ii+4]);
        if( cell.aCoord[ii].f>cell.aCoord[ii+1].f ){
          rc = rtreeConstraintError(pRtree, ii+1);
          goto constraint;
        }
      }
    }else
#endif
    {
      for(ii=0; ii<nn; ii+=2){
        cell.aCoord[ii].i = sqlite3_value_int(aData[ii+3]);
        cell.aCoord[ii+1].i = sqlite3_value_int(aData[ii+4]);
        if( cell.aCoord[ii].i>cell.aCoord[ii+1].i ){
          rc = rtreeConstraintError(pRtree, ii+1);
          goto constraint;
        }
      }
    }

    /* If a rowid value was supplied, check if it is already present in 
    ** the table. If so, the constraint has failed. */
    if( sqlite3_value_type(aData[2])!=SQLITE_NULL ){
      cell.iRowid = sqlite3_value_int64(aData[2]);
      if( sqlite3_value_type(aData[0])==SQLITE_NULL
       || sqlite3_value_int64(aData[0])!=cell.iRowid
      ){
        int steprc;
        sqlite3_bind_int64(pRtree->pReadRowid, 1, cell.iRowid);
        steprc = sqlite3_step(pRtree->pReadRowid);
        rc = sqlite3_reset(pRtree->pReadRowid);
        if( SQLITE_ROW==steprc ){
          if( sqlite3_vtab_on_conflict(pRtree->db)==SQLITE_REPLACE ){
            rc = rtreeDeleteRowid(pRtree, cell.iRowid);
          }else{
            rc = rtreeConstraintError(pRtree, 0);
            goto constraint;
          }
        }
      }
      bHaveRowid = 1;
    }
  }

  /* If aData[0] is not an SQL NULL value, it is the rowid of a
  ** record to delete from the r-tree table. The following block does
  ** just that.
  */
  if( sqlite3_value_type(aData[0])!=SQLITE_NULL ){
    rc = rtreeDeleteRowid(pRtree, sqlite3_value_int64(aData[0]));
  }

  /* If the aData[] array contains more than one element, elements
  ** (aData[2]..aData[argc-1]) contain a new record to insert into
  ** the r-tree structure.
  */
  if( rc==SQLITE_OK && nData>1 ){
    /* Insert the new record into the r-tree */
    RtreeNode *pLeaf = 0;

    /* Figure out the rowid of the new row. */
    if( bHaveRowid==0 ){
      rc = rtreeNewRowid(pRtree, &cell.iRowid);
    }
    *pRowid = cell.iRowid;

    if( rc==SQLITE_OK ){
      rc = ChooseLeaf(pRtree, &cell, 0, &pLeaf);
    }
    if( rc==SQLITE_OK ){
      int rc2;
      pRtree->iReinsertHeight = -1;
      rc = rtreeInsertCell(pRtree, pLeaf, &cell, 0);
      rc2 = nodeRelease(pRtree, pLeaf);
      if( rc==SQLITE_OK ){
        rc = rc2;
      }
    }
    if( rc==SQLITE_OK && pRtree->nAux ){
      sqlite3_stmt *pUp = pRtree->pWriteAux;
      int jj;
      sqlite3_bind_int64(pUp, 1, *pRowid);
      for(jj=0; jj<pRtree->nAux; jj++){
        sqlite3_bind_value(pUp, jj+2, aData[pRtree->nDim2+3+jj]);
      }
      sqlite3_step(pUp);
      rc = sqlite3_reset(pUp);
    }
  }

constraint:
  rtreeRelease(pRtree);
  return rc;
}